

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O1

void __thiscall
OpenMD::ReplicateVisitor::replicate
          (ReplicateVisitor *this,
          vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
          *infoList,shared_ptr<OpenMD::AtomData> *data,Mat3x3d *box)

{
  element_type *peVar1;
  RealType RVar2;
  element_type *peVar3;
  AtomInfo *pAVar4;
  uint i;
  long lVar5;
  double (*padVar6) [3];
  long lVar7;
  pointer pVVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  pointer psVar9;
  AtomInfo *pAVar10;
  double adStack_a0 [4];
  undefined1 local_79;
  AtomInfo *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined8 local_68;
  value_type local_58;
  ReplicateVisitor *local_48;
  shared_ptr<OpenMD::AtomData> *local_40;
  double (*local_38) [3];
  
  pVVar8 = (this->dir).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_48 = this;
  local_40 = data;
  local_38 = (double (*) [3])box;
  if (pVVar8 == (this->dir).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      psVar9 = (infoList->
               super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      this_01._M_pi = this_00._M_pi;
      if (psVar9 != (infoList->
                    super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          local_78 = (element_type *)0x0;
          adStack_a0[2] = 1.09712661974588e-317;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<OpenMD::AtomInfo,std::allocator<OpenMD::AtomInfo>>
                    (&_Stack_70,&local_78,(allocator<OpenMD::AtomInfo> *)&local_79);
          this_00._M_pi = _Stack_70._M_pi;
          pAVar4 = local_78;
          local_78 = (AtomInfo *)0x0;
          _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            adStack_a0[2] = 1.0971429239122e-317;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
          }
          if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            adStack_a0[2] = 1.09715033489689e-317;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
          }
          peVar1 = (psVar9->super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          adStack_a0[2] = 1.09715725181593e-317;
          std::__cxx11::string::_M_assign((string *)pAVar4);
          pAVar4->globalID = peVar1->globalID;
          if (pAVar4 != peVar1) {
            lVar5 = 0;
            do {
              (pAVar4->pos).super_Vector<double,_3U>.data_[lVar5] =
                   (peVar1->pos).super_Vector<double,_3U>.data_[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
          }
          if (pAVar4 != peVar1) {
            lVar5 = 0;
            do {
              (pAVar4->vec).super_Vector<double,_3U>.data_[lVar5] =
                   (peVar1->vec).super_Vector<double,_3U>.data_[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
          }
          if (pAVar4 != peVar1) {
            lVar5 = 0;
            do {
              (pAVar4->vel).super_Vector<double,_3U>.data_[lVar5] =
                   (peVar1->vel).super_Vector<double,_3U>.data_[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
          }
          if (pAVar4 != peVar1) {
            lVar5 = 0;
            do {
              (pAVar4->frc).super_Vector<double,_3U>.data_[lVar5] =
                   (peVar1->frc).super_Vector<double,_3U>.data_[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
          }
          if (pAVar4 != peVar1) {
            lVar5 = 0;
            do {
              (pAVar4->eField).super_Vector<double,_3U>.data_[lVar5] =
                   (peVar1->eField).super_Vector<double,_3U>.data_[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
          }
          RVar2 = peVar1->charge;
          *(undefined8 *)((long)&pAVar4->charge + 6) = *(undefined8 *)((long)&peVar1->charge + 6);
          pAVar4->charge = RVar2;
          local_78 = (AtomInfo *)0x0;
          _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_68 = 0;
          lVar5 = 0;
          padVar6 = local_38;
          do {
            pAVar10 = (&local_78)[lVar5];
            lVar7 = 0;
            do {
              pAVar10 = (AtomInfo *)
                        ((double)pAVar10 +
                        (((SquareMatrix<double,_3> *)*padVar6)->super_RectMatrix<double,_3U,_3U>).
                        data_[0][lVar7] * (pVVar8->super_Vector<double,_3U>).data_[lVar7]);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            (&local_78)[lVar5] = pAVar10;
            lVar5 = lVar5 + 1;
            padVar6 = padVar6 + 1;
          } while (lVar5 != 3);
          lVar5 = 5;
          do {
            (pAVar4->pos).super_Vector<double,_3U>.data_[lVar5 + -5] =
                 adStack_a0[lVar5] + (pAVar4->pos).super_Vector<double,_3U>.data_[lVar5 + -5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 8);
          peVar3 = (local_40->super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_58.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pAVar4;
          local_58.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = this_00._M_pi;
          if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            }
          }
          adStack_a0[2] = 1.09733560951408e-317;
          std::
          vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
          ::push_back(&peVar3->data,&local_58);
          if (local_58.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            adStack_a0[2] = 1.09734302049876e-317;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_58.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          psVar9 = psVar9 + 1;
          this_01._M_pi = this_00._M_pi;
        } while (psVar9 != (infoList->
                           super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
      }
      pVVar8 = pVVar8 + 1;
    } while (pVVar8 != (local_48->dir).
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    adStack_a0[2] = 1.09737315850316e-317;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return;
}

Assistant:

void ReplicateVisitor::replicate(
      std::vector<std::shared_ptr<AtomInfo>>& infoList,
      std::shared_ptr<AtomData> data, const Mat3x3d& box) {
    std::shared_ptr<AtomInfo> newAtomInfo;
    std::vector<Vector3d>::iterator dirIter;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;

    for (dirIter = dir.begin(); dirIter != dir.end(); ++dirIter) {
      for (i = infoList.begin(); i != infoList.end(); ++i) {
        newAtomInfo  = std::make_shared<AtomInfo>();
        *newAtomInfo = *(*i);
        newAtomInfo->pos += box * (*dirIter);
        data->addAtomInfo(newAtomInfo);
      }
    }
  }